

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl-array-type.cpp
# Opt level: O2

Up __thiscall yactfr::DynamicLengthArrayType::_clone(DynamicLengthArrayType *this)

{
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> _Var1;
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  undefined1 local_30 [8];
  undefined1 local_28 [16];
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_18;
  
  local_28._12_4_ = *(uint *)(in_RSI + 0xc);
  DataType::clone((DataType *)local_28,*(__fn **)(in_RSI + 0x20),in_RDX,in_ECX,in_R8);
  internal::tryCloneAttrs((MapItem *)local_30);
  std::
  make_unique<yactfr::DynamicLengthArrayType_const,unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation_const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)&local_18,
             (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             (local_28 + 0xc),(DataLocation *)local_28,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 0x28));
  _Var1._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  (this->super_ArrayType).super_CompoundDataType.super_DataType._vptr_DataType =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  std::
  unique_ptr<const_yactfr::DynamicLengthArrayType,_std::default_delete<const_yactfr::DynamicLengthArrayType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::DynamicLengthArrayType,_std::default_delete<const_yactfr::DynamicLengthArrayType>_>
                 *)&local_18);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_30);
  if ((_func_int **)local_28._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_28._0_8_ + 8))();
  }
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up DynamicLengthArrayType::_clone() const
{
    return DynamicLengthArrayType::create(this->alignment(), this->elementType().clone(), _lenLoc,
                                          internal::tryCloneAttrs(this->attributes()));
}